

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void rotate_x_flags(TCGContext_conflict2 *tcg_ctx,TCGv_i32 reg,TCGv_i32 X,int size)

{
  uintptr_t o_5;
  uintptr_t o_1;
  
  if (size == 0x10) {
    tcg_gen_ext16s_i32_m68k(tcg_ctx,reg,reg);
  }
  else if (size == 8) {
    tcg_gen_ext8s_i32_m68k(tcg_ctx,reg,reg);
  }
  if (QREG_CC_N != reg) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_N + (long)tcg_ctx),
                     (TCGArg)(reg + (long)&tcg_ctx->pool_cur));
  }
  if (QREG_CC_Z != reg) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                     (TCGArg)(reg + (long)tcg_ctx));
  }
  if (QREG_CC_X != X) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_X + (long)tcg_ctx),
                     (TCGArg)(X + (long)&tcg_ctx->pool_cur));
  }
  if (QREG_CC_C != X) {
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(QREG_CC_C + (long)tcg_ctx),
                     (TCGArg)(X + (long)tcg_ctx));
  }
  tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),0);
  return;
}

Assistant:

static void rotate_x_flags(TCGContext *tcg_ctx, TCGv reg, TCGv X, int size)
{
    switch (size) {
    case 8:
        tcg_gen_ext8s_i32(tcg_ctx, reg, reg);
        break;
    case 16:
        tcg_gen_ext16s_i32(tcg_ctx, reg, reg);
        break;
    default:
        break;
    }
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_N, reg);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_Z, reg);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_X, X);
    tcg_gen_mov_i32(tcg_ctx, QREG_CC_C, X);
    tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, 0);
}